

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text2mecab.c
# Opt level: O3

void text2mecab(char *output,char *input)

{
  size_t sVar1;
  long lVar2;
  char cVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  
  sVar1 = strlen(input);
  uVar10 = 0;
  if (0 < (int)sVar1) {
    iVar7 = 0;
LAB_0016d529:
    iVar8 = (int)uVar10;
    pcVar6 = input + iVar8;
    uVar5 = 0;
    do {
      cVar3 = *text2mecab_conv_list[uVar5];
      lVar2 = 0;
      if (cVar3 == '\0') {
LAB_0016d574:
        uVar10 = (ulong)(uint)((int)lVar2 + iVar8);
        pcVar6 = *(char **)((long)text2mecab_conv_list + ((uVar5 & 0xffffffff) << 3 | 8));
        cVar3 = *pcVar6;
        if (cVar3 != '\0') {
          lVar2 = 0;
          do {
            output[lVar2 + iVar7] = cVar3;
            cVar3 = pcVar6[lVar2 + 1];
            lVar2 = lVar2 + 1;
          } while (cVar3 != '\0');
          iVar7 = iVar7 + (int)lVar2;
        }
        goto LAB_0016d602;
      }
      do {
        if (pcVar6[lVar2] != cVar3) goto LAB_0016d558;
        cVar3 = text2mecab_conv_list[uVar5][lVar2 + 1];
        lVar2 = lVar2 + 1;
      } while (cVar3 != '\0');
      if (lVar2 != 0xffffffff) goto LAB_0016d574;
LAB_0016d558:
      uVar5 = uVar5 + 2;
    } while (uVar5 != 0x170);
    cVar3 = *pcVar6;
    if (cVar3 < '\0') {
      uVar10 = 0;
LAB_0016d5aa:
      if ((cVar3 < text2mecab_kanji_range[uVar10 + 1]) ||
         (text2mecab_kanji_range[uVar10 + 2] < cVar3)) goto LAB_0016d5b8;
      if ((0x49UL >> (uVar10 & 0x3f) & 1) != 0) {
        uVar4 = (uint)(byte)text2mecab_kanji_range[uVar10];
        if (text2mecab_kanji_range[uVar10] < '\x02') {
          uVar4 = 1;
        }
        lVar2 = 0;
        do {
          output[lVar2 + iVar7] = pcVar6[lVar2];
          lVar2 = lVar2 + 1;
          uVar9 = (uint)lVar2;
        } while (uVar4 != uVar9);
        iVar7 = iVar7 + uVar9;
        uVar9 = iVar8 + uVar9;
        goto LAB_0016d5ff;
      }
      goto LAB_0016d60f;
    }
    goto LAB_0016d56c;
  }
LAB_0016d650:
  output[uVar10] = '\0';
  return;
LAB_0016d5b8:
  uVar5 = uVar10 & 0x3f;
  uVar10 = uVar10 + 3;
  if ((9UL >> uVar5 & 1) == 0) goto LAB_0016d60f;
  goto LAB_0016d5aa;
LAB_0016d60f:
  fwrite("WARNING: text2mecab() in text2mecab.c: Wrong character.\n",0x38,1,_stderr);
LAB_0016d56c:
  uVar9 = iVar8 + 1;
LAB_0016d5ff:
  uVar10 = (ulong)uVar9;
LAB_0016d602:
  if ((int)sVar1 <= (int)uVar10) goto LAB_0016d647;
  goto LAB_0016d529;
LAB_0016d647:
  uVar10 = (ulong)iVar7;
  goto LAB_0016d650;
}

Assistant:

void text2mecab(char *output, const char *input)
{
   int i, j;
   const int length = strlen(input);
   const char *str;
   int index = 0;
   int s, e = -1;

   for (s = 0; s < length;) {
      str = &input[s];
      /* search */
      for (i = 0; text2mecab_conv_list[i] != NULL; i += 2) {
         e = strtopcmp(str, text2mecab_conv_list[i]);
         if (e != -1)
            break;
      }
      if (e != -1) {
         /* convert */
         s += e;
         str = text2mecab_conv_list[i + 1];
         for (j = 0; str[j] != '\0'; j++)
            output[index++] = str[j];
      } else if (text2mecab_control_range[0] <= str[0] && str[0] <= text2mecab_control_range[1]) {
         /* control character */
         s++;
      } else {
         /* multi byte character */
         e = -1;
         for (j = 0; text2mecab_kanji_range[j] > 0; j += 3) {
            if (text2mecab_kanji_range[j + 1] <= str[0] && text2mecab_kanji_range[j + 2] >= str[0]) {
               e = text2mecab_kanji_range[j];
               break;
            }
         }
         if (e > 0) {
            for (j = 0; j < e; j++)
               output[index++] = input[s++];
         } else {
            /* unknown */
            fprintf(stderr, "WARNING: text2mecab() in text2mecab.c: Wrong character.\n");
            s++;
         }
      }
   }
   output[index] = '\0';
}